

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalUnixMakefileGenerator3.cxx
# Opt level: O2

void __thiscall
cmLocalUnixMakefileGenerator3::GetLocalObjectFiles
          (cmLocalUnixMakefileGenerator3 *this,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmLocalUnixMakefileGenerator3::LocalObjectInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmLocalUnixMakefileGenerator3::LocalObjectInfo>_>_>
          *localObjectFiles)

{
  cmMakefile *this_00;
  cmSourceFile *source;
  cmGeneratorTarget *pcVar1;
  bool bVar2;
  TargetType TVar3;
  char *pcVar4;
  mapped_type *this_01;
  pointer ppcVar5;
  pointer ppcVar6;
  bool hasSourceExtension;
  vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> objectSources;
  string dir;
  vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> targets;
  string objectName;
  bool local_109;
  cmLocalUnixMakefileGenerator3 *local_108;
  cmGeneratorTarget *local_100;
  _Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> local_f8;
  string local_e0;
  pointer local_c0;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmLocalUnixMakefileGenerator3::LocalObjectInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmLocalUnixMakefileGenerator3::LocalObjectInfo>_>_>
  *local_b8;
  undefined1 local_b0 [40];
  _Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> local_88;
  string local_70;
  string local_50;
  
  local_108 = this;
  local_b8 = localObjectFiles;
  std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>::vector
            ((vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> *)&local_88,
             &(this->super_cmLocalCommonGenerator).super_cmLocalGenerator.GeneratorTargets);
  ppcVar5 = local_88._M_impl.super__Vector_impl_data._M_start;
  while( true ) {
    if (ppcVar5 == local_88._M_impl.super__Vector_impl_data._M_finish) break;
    local_100 = *ppcVar5;
    TVar3 = cmGeneratorTarget::GetType(local_100);
    if (TVar3 != INTERFACE_LIBRARY) {
      local_f8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_f8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_f8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      this_00 = (local_108->super_cmLocalCommonGenerator).super_cmLocalGenerator.Makefile;
      std::__cxx11::string::string((string *)&local_e0,"CMAKE_BUILD_TYPE",(allocator *)&local_50);
      pcVar4 = cmMakefile::GetSafeDefinition(this_00,&local_e0);
      std::__cxx11::string::string((string *)local_b0,pcVar4,(allocator *)&local_70);
      pcVar1 = local_100;
      cmGeneratorTarget::GetObjectSources
                (local_100,
                 (vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)&local_f8,
                 (string *)local_b0);
      std::__cxx11::string::~string((string *)local_b0);
      std::__cxx11::string::~string((string *)&local_e0);
      local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
      local_e0._M_string_length = 0;
      local_e0.field_2._M_local_buf[0] = '\0';
      cmLocalGenerator::GetCurrentBinaryDirectory(pcVar1->LocalGenerator);
      std::__cxx11::string::append((char *)&local_e0);
      std::__cxx11::string::append((char *)&local_e0);
      (*(local_108->super_cmLocalCommonGenerator).super_cmLocalGenerator._vptr_cmLocalGenerator[0xb]
      )((string *)local_b0,local_108,local_100);
      std::__cxx11::string::append((string *)&local_e0);
      std::__cxx11::string::~string((string *)local_b0);
      std::__cxx11::string::append((char *)&local_e0);
      local_c0 = ppcVar5;
      for (ppcVar6 = local_f8._M_impl.super__Vector_impl_data._M_start;
          ppcVar6 != local_f8._M_impl.super__Vector_impl_data._M_finish; ppcVar6 = ppcVar6 + 1) {
        source = *ppcVar6;
        local_109 = true;
        cmLocalGenerator::GetObjectFileNameWithoutTarget
                  (&local_50,(cmLocalGenerator *)local_108,source,&local_e0,&local_109);
        bVar2 = cmsys::SystemTools::FileIsFullPath(local_50._M_dataplus._M_p);
        if (bVar2) {
          cmsys::SystemTools::GetFilenameName((string *)local_b0,&local_50);
          std::__cxx11::string::operator=((string *)&local_50,(string *)local_b0);
          std::__cxx11::string::~string((string *)local_b0);
        }
        this_01 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmLocalUnixMakefileGenerator3::LocalObjectInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmLocalUnixMakefileGenerator3::LocalObjectInfo>_>_>
                  ::operator[](local_b8,&local_50);
        this_01->HasSourceExtension = local_109;
        cmSourceFile::GetLanguage_abi_cxx11_(&local_70,source);
        local_b0._0_8_ = local_100;
        std::__cxx11::string::string((string *)(local_b0 + 8),(string *)&local_70);
        std::
        vector<cmLocalUnixMakefileGenerator3::LocalObjectEntry,_std::allocator<cmLocalUnixMakefileGenerator3::LocalObjectEntry>_>
        ::emplace_back<cmLocalUnixMakefileGenerator3::LocalObjectEntry>
                  (&this_01->
                    super_vector<cmLocalUnixMakefileGenerator3::LocalObjectEntry,_std::allocator<cmLocalUnixMakefileGenerator3::LocalObjectEntry>_>
                   ,(LocalObjectEntry *)local_b0);
        std::__cxx11::string::~string((string *)(local_b0 + 8));
        std::__cxx11::string::~string((string *)&local_70);
        std::__cxx11::string::~string((string *)&local_50);
      }
      std::__cxx11::string::~string((string *)&local_e0);
      std::_Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::~_Vector_base
                (&local_f8);
      ppcVar5 = local_c0;
    }
    ppcVar5 = ppcVar5 + 1;
  }
  std::_Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>::~_Vector_base
            (&local_88);
  return;
}

Assistant:

void cmLocalUnixMakefileGenerator3::
GetLocalObjectFiles(std::map<std::string, LocalObjectInfo> &localObjectFiles)
{
  std::vector<cmGeneratorTarget*> targets = this->GetGeneratorTargets();
  for(std::vector<cmGeneratorTarget*>::iterator ti = targets.begin();
      ti != targets.end(); ++ti)
    {
    cmGeneratorTarget* gt = *ti;
    if (gt->GetType() == cmState::INTERFACE_LIBRARY)
      {
      continue;
      }
    std::vector<cmSourceFile const*> objectSources;
    gt->GetObjectSources(objectSources, this->Makefile
                                    ->GetSafeDefinition("CMAKE_BUILD_TYPE"));
    // Compute full path to object file directory for this target.
    std::string dir;
    dir += gt->LocalGenerator->GetCurrentBinaryDirectory();
    dir += "/";
    dir += this->GetTargetDirectory(gt);
    dir += "/";
    // Compute the name of each object file.
    for(std::vector<cmSourceFile const*>::iterator
          si = objectSources.begin();
        si != objectSources.end(); ++si)
      {
      cmSourceFile const* sf = *si;
      bool hasSourceExtension = true;
      std::string objectName = this->GetObjectFileNameWithoutTarget(*sf,
                                                                    dir,
                                                        &hasSourceExtension);
      if(cmSystemTools::FileIsFullPath(objectName.c_str()))
        {
        objectName = cmSystemTools::GetFilenameName(objectName);
        }
      LocalObjectInfo& info = localObjectFiles[objectName];
      info.HasSourceExtension = hasSourceExtension;
      info.push_back(LocalObjectEntry(gt, sf->GetLanguage()));
      }
    }
}